

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

DataStream * __thiscall DataStream::operator<<(DataStream *this,DBHashKey *obj)

{
  long lVar1;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  DataStream *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,_(anonymous_namespace)::DBHashKey>
            (in_stack_ffffffffffffffd8,(DBHashKey *)0x93c320);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

DataStream& operator<<(const T& obj)
    {
        ::Serialize(*this, obj);
        return (*this);
    }